

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasuEigen.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  reference this;
  reference pvVar2;
  ostream *poVar3;
  rep rVar4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_e8;
  duration<double,_std::ratio<1L,_1L>_> local_e0;
  double local_d8;
  double elap_us;
  time_point endTime;
  double v;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_b8;
  int i_2;
  time_point startTime;
  double y;
  double x;
  double r;
  int N;
  undefined1 local_88 [8];
  vector<double,_std::allocator<double>_> b;
  int local_68;
  int j;
  int i_1;
  allocator<double> local_51;
  value_type local_50;
  vector<double,_std::allocator<double>_> local_48;
  int local_30;
  undefined4 local_2c;
  int i;
  int M;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  a;
  
  a.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&i);
  local_2c = 8;
  for (local_30 = 0; local_30 < 9; local_30 = local_30 + 1) {
    local_50 = 0.0;
    std::allocator<double>::allocator(&local_51);
    std::vector<double,_std::allocator<double>_>::vector(&local_48,9,&local_50,&local_51);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&i,&local_48);
    std::vector<double,_std::allocator<double>_>::~vector(&local_48);
    std::allocator<double>::~allocator(&local_51);
  }
  for (local_68 = 0; local_68 < 9; local_68 = local_68 + 1) {
    for (b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = 0;
        b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < 9;
        b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1) {
      iVar1 = local_68 +
              b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_;
      this = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&i,(long)local_68);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this,(long)b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_);
      *pvVar2 = (double)iVar1;
    }
  }
  _N = 0.0;
  std::allocator<double>::allocator((allocator<double> *)((long)&r + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_88,9,(value_type *)&N,
             (allocator<double> *)((long)&r + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&r + 7));
  r._0_4_ = 1000000;
  x = 0.0;
  startTime.__d.__r = (duration)0x3fe6666666666666;
  tStack_b8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (v._4_4_ = 0; v._4_4_ < r._0_4_; v._4_4_ = v._4_4_ + 1) {
    endTime.__d.__r =
         (duration)
         Clenshaw2D<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,std::vector<double,std::allocator<double>>>
                   ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)&i,0.1,(double)startTime.__d.__r,
                    (vector<double,_std::allocator<double>_> *)local_88);
    x = x + (double)endTime.__d.__r;
  }
  elap_us = (double)std::chrono::_V2::system_clock::now();
  local_e8.__r = (rep_conflict)
                 std::chrono::operator-
                           ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)&elap_us,&stack0xffffffffffffff48);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_e0,&local_e8);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_e0);
  local_d8 = (rVar4 / (double)r._0_4_) * 1000000.0;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_d8);
  poVar3 = std::operator<<(poVar3," us/call. value:");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,x / (double)r._0_4_);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_88);
  poVar3 = std::operator<<((ostream *)&std::cout,"Dynamic:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  test_Eigen<_1,_1>(8);
  poVar3 = std::operator<<((ostream *)&std::cout,"Static:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  test_Eigen<9,9>(8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&i);
  return a.
         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main(){
    std::vector<std::vector<double>> a;
    const int M = 8;
    for (auto i = 0; i <= M; ++i){
        a.push_back(std::vector<double>(M+1, 0.0)); // One would normally use Eigen here, but the challenge is to use only standard library elements...
    }
    {
        for (auto i = 0; i < M + 1; ++i) {
            for (auto j = 0; j < M + 1; ++j) {
                a[i][j] = i + j;
            }
        }
        std::vector<double> b(M+1, 0.0);
        int N = 1000 * 1000;
        volatile auto r = 0.0, x = 0.1, y = 0.7;
        auto startTime = std::chrono::system_clock::now();
        for (int i = 0; i < N; ++i) {
            auto v = Clenshaw2D(a, x, y, b);
            r += v;
        }
        auto endTime = std::chrono::system_clock::now();
        auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N * 1e6;
        std::cout << elap_us << " us/call. value:" << (r / N) << std::endl;
    }
    std::cout  << "Dynamic:" << std::endl;
    test_Eigen<Eigen::Dynamic, Eigen::Dynamic>(M);

    std::cout  << "Static:" << std::endl;
    test_Eigen<M+1, M+1>(M);
}